

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O1

int MatroskaDemuxer::matroska_ebmlnum_uint(uint8_t *data,int32_t size,uint64_t *num)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = 0xffffffff;
  if (0 < size) {
    bVar1 = *data;
    if ((char)bVar1 < '\0') {
      uVar6 = 0x7f;
      uVar5 = 1;
    }
    else {
      uVar6 = 0x80;
      uVar4 = 1;
      do {
        uVar5 = uVar4 + 1;
        uVar6 = uVar6 >> 1;
        if (7 < uVar4) break;
        uVar4 = uVar5;
      } while (((uint)uVar6 & (uint)bVar1) == 0);
      uVar6 = uVar6 - 1;
    }
    if ((int)uVar5 <= size && uVar5 < 9) {
      uVar3 = (ulong)((uint)bVar1 & (uint)uVar6);
      uVar2 = (uint)(uVar3 == uVar6);
      if (1 < uVar5) {
        uVar7 = 1;
        uVar2 = (uint)(uVar3 == uVar6);
        do {
          uVar2 = uVar2 + ((ulong)data[uVar7] == 0xff);
          uVar3 = uVar3 << 8 | (ulong)data[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      uVar6 = 0xffffffffffffffff;
      if (uVar5 != uVar2) {
        uVar6 = uVar3;
      }
      *num = uVar6;
      uVar2 = uVar5;
    }
  }
  return uVar2;
}

Assistant:

int MatroskaDemuxer::matroska_ebmlnum_uint(const uint8_t *data, const int32_t size, uint64_t *num)
{
    int read = 1, n = 1, num_ffs = 0;
    uint64_t len_mask = 0x80;

    if (size <= 0)
        return AVERROR_INVALIDDATA;

    uint64_t total = data[0];
    while (read <= 8 && !(total & len_mask))
    {
        read++;
        len_mask >>= 1;
    }
    if (read > 8)
        return AVERROR_INVALIDDATA;

    if ((total &= (len_mask - 1)) == len_mask - 1)
        num_ffs++;
    if (size < read)
        return AVERROR_INVALIDDATA;
    while (n < read)
    {
        if (data[n] == 0xff)
            num_ffs++;
        total = (total << 8) | data[n];
        n++;
    }

    if (read == num_ffs)
        *num = ULLONG_MAX;
    else
        *num = total;

    return read;
}